

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

bool __thiscall
gguf_reader::read<char>(gguf_reader *this,vector<char,_std::allocator<char>_> *dst,size_t n)

{
  pointer pcVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  
  std::vector<char,_std::allocator<char>_>::resize(dst,n);
  pcVar1 = (dst->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  bVar4 = (dst->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish == pcVar1;
  if (!bVar4) {
    uVar3 = 1;
    sVar2 = fread(pcVar1,1,1,(FILE *)this->file);
    while (sVar2 == 1) {
      pcVar1 = (dst->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar4 = (ulong)((long)(dst->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pcVar1) <= uVar3;
      if (bVar4) {
        return bVar4;
      }
      sVar2 = fread(pcVar1 + uVar3,1,1,(FILE *)this->file);
      uVar3 = uVar3 + 1;
    }
  }
  return bVar4;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }